

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v9::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  
  compare(this,other);
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 != 0) {
    iVar4 = other->exp_ - this->exp_;
    puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar5 = 0;
    lVar7 = 0;
    do {
      uVar9 = iVar4 + (int)sVar5;
      lVar8 = (ulong)puVar3[uVar9] + (lVar7 - (ulong)puVar2[sVar5]);
      puVar3[uVar9] = (uint)lVar8;
      lVar7 = lVar8 >> 0x3f;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
    if (lVar8 < 0) {
      uVar9 = iVar4 + (int)sVar5;
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar6 = (ulong)puVar2[uVar9];
      lVar7 = -1;
      do {
        uVar6 = (uVar6 & 0xffffffff) + lVar7;
        lVar7 = (long)uVar6 >> 0x3f;
      } while ((long)uVar6 < 0);
      puVar2[uVar9] = (uint)uVar6;
    }
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }